

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O3

void av1_init_second_pass(AV1_COMP *cpi)

{
  undefined4 uVar1;
  undefined4 uVar2;
  AV1_PRIMARY *pAVar3;
  FIRSTPASS_STATS *first_stats;
  FIRSTPASS_STATS *pFVar4;
  AV1_PRIMARY *pAVar5;
  STATS_BUFFER_CTX *pSVar6;
  FIRSTPASS_STATS *pFVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  
  pAVar3 = cpi->ppi;
  pSVar6 = (pAVar3->twopass).stats_buf_ctx;
  pFVar7 = pSVar6->stats_in_end;
  if (pFVar7 != (FIRSTPASS_STATS *)0x0) {
    first_stats = pSVar6->stats_in_start;
    for (pFVar4 = first_stats; pFVar4 < pFVar7 + -1; pFVar4 = pFVar4 + 1) {
      pFVar4->is_flash =
           (ulong)(-(uint)(0.5 <= pFVar4[1].pcnt_second_ref &&
                          pFVar4[1].pcnt_inter < pFVar4[1].pcnt_second_ref) & 1);
    }
    if (first_stats <= pFVar7 + -1) {
      pFVar7[-1].is_flash = 0;
    }
    estimate_noise(first_stats,pFVar7,(cpi->common).error);
    pSVar6 = (pAVar3->twopass).stats_buf_ctx;
    estimate_coeff(pSVar6->stats_in_start,pSVar6->stats_in_end);
    pSVar6 = (pAVar3->twopass).stats_buf_ctx;
    pFVar7 = pSVar6->stats_in_end;
    pFVar4 = pSVar6->total_stats;
    memcpy(pFVar4,pFVar7,0xe8);
    memmove(((pAVar3->twopass).stats_buf_ctx)->total_left_stats,pFVar7,0xe8);
    av1_new_framerate(cpi,(pFVar4->count * 10000000.0) / pFVar4->duration);
    (pAVar3->twopass).bits_left =
         (long)(((double)(cpi->oxcf).rc_cfg.target_bandwidth * pFVar4->duration) / 10000000.0);
    (pAVar3->twopass).sr_update_lag = 1;
    dVar10 = 0.0;
    dVar8 = pFVar4->coded_error /
            (pFVar4->count + *(double *)(&DAT_004d9c40 + (ulong)(pFVar4->count < 0.0) * 8));
    pFVar7 = (cpi->twopass_frame).stats_in;
    uVar1 = (cpi->oxcf).rc_cfg.vbrmin_section;
    uVar2 = (cpi->oxcf).rc_cfg.vbrmax_section;
    auVar9._0_8_ = dVar8 * (double)(int)uVar1;
    auVar9._8_8_ = dVar8 * (double)(int)uVar2;
    auVar9 = divpd(auVar9,_DAT_004fc790);
    (pAVar3->twopass).modified_error_min = (double)auVar9._0_8_;
    (pAVar3->twopass).modified_error_max = (double)auVar9._8_8_;
    pSVar6 = (pAVar3->twopass).stats_buf_ctx;
    if (pFVar7 < pSVar6->stats_in_end) {
      do {
        dVar8 = calculate_modified_err_new
                          (&cpi->frame_info,pSVar6->total_stats,pFVar7,(cpi->oxcf).rc_cfg.vbrbias,
                           (pAVar3->twopass).modified_error_min,(pAVar3->twopass).modified_error_max
                          );
        dVar10 = dVar10 + dVar8;
        pFVar7 = pFVar7 + 1;
        pSVar6 = (pAVar3->twopass).stats_buf_ctx;
      } while (pFVar7 < pSVar6->stats_in_end);
    }
    (pAVar3->twopass).modified_error_left = dVar10;
    pAVar5 = cpi->ppi;
    (pAVar5->p_rc).rate_error_estimate = 0;
    (pAVar5->p_rc).vbr_bits_off_target = 0;
    (pAVar5->p_rc).vbr_bits_off_target_fast = 0;
    (pAVar3->twopass).kf_zeromotion_pct = 100;
    (pAVar3->twopass).last_kfgroup_zeromotion_pct = 100;
    (pAVar3->twopass).bpm_factor = 1.0;
    (pAVar3->twopass).rolling_arf_group_target_bits = 1;
    (pAVar3->twopass).rolling_arf_group_actual_bits = 1;
  }
  return;
}

Assistant:

void av1_init_second_pass(AV1_COMP *cpi) {
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  FRAME_INFO *const frame_info = &cpi->frame_info;
  double frame_rate;
  FIRSTPASS_STATS *stats;

  if (!twopass->stats_buf_ctx->stats_in_end) return;

  mark_flashes(twopass->stats_buf_ctx->stats_in_start,
               twopass->stats_buf_ctx->stats_in_end);
  estimate_noise(twopass->stats_buf_ctx->stats_in_start,
                 twopass->stats_buf_ctx->stats_in_end, cpi->common.error);
  estimate_coeff(twopass->stats_buf_ctx->stats_in_start,
                 twopass->stats_buf_ctx->stats_in_end);

  stats = twopass->stats_buf_ctx->total_stats;

  *stats = *twopass->stats_buf_ctx->stats_in_end;
  *twopass->stats_buf_ctx->total_left_stats = *stats;

  frame_rate = 10000000.0 * stats->count / stats->duration;
  // Each frame can have a different duration, as the frame rate in the source
  // isn't guaranteed to be constant. The frame rate prior to the first frame
  // encoded in the second pass is a guess. However, the sum duration is not.
  // It is calculated based on the actual durations of all frames from the
  // first pass.
  av1_new_framerate(cpi, frame_rate);
  twopass->bits_left =
      (int64_t)(stats->duration * oxcf->rc_cfg.target_bandwidth / 10000000.0);

#if CONFIG_BITRATE_ACCURACY
  av1_vbr_rc_init(&cpi->vbr_rc_info, twopass->bits_left,
                  (int)round(stats->count));
#endif

#if CONFIG_RATECTRL_LOG
  rc_log_init(&cpi->rc_log);
#endif

  // This variable monitors how far behind the second ref update is lagging.
  twopass->sr_update_lag = 1;

  // Scan the first pass file and calculate a modified total error based upon
  // the bias/power function used to allocate bits.
  {
    const double avg_error =
        stats->coded_error / DOUBLE_DIVIDE_CHECK(stats->count);
    const FIRSTPASS_STATS *s = cpi->twopass_frame.stats_in;
    double modified_error_total = 0.0;
    twopass->modified_error_min =
        (avg_error * oxcf->rc_cfg.vbrmin_section) / 100;
    twopass->modified_error_max =
        (avg_error * oxcf->rc_cfg.vbrmax_section) / 100;
    while (s < twopass->stats_buf_ctx->stats_in_end) {
      modified_error_total +=
          calculate_modified_err(frame_info, twopass, oxcf, s);
      ++s;
    }
    twopass->modified_error_left = modified_error_total;
  }

  // Reset the vbr bits off target counters
  cpi->ppi->p_rc.vbr_bits_off_target = 0;
  cpi->ppi->p_rc.vbr_bits_off_target_fast = 0;

  cpi->ppi->p_rc.rate_error_estimate = 0;

  // Static sequence monitor variables.
  twopass->kf_zeromotion_pct = 100;
  twopass->last_kfgroup_zeromotion_pct = 100;

  // Initialize bits per macro_block estimate correction factor.
  twopass->bpm_factor = 1.0;
  // Initialize actual and target bits counters for ARF groups so that
  // at the start we have a neutral bpm adjustment.
  twopass->rolling_arf_group_target_bits = 1;
  twopass->rolling_arf_group_actual_bits = 1;
}